

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  iterator __position;
  int *piVar1;
  void *__ptr;
  long *plVar2;
  bool bVar3;
  Net *pNVar4;
  int iVar5;
  int iVar6;
  Layer *pLVar7;
  size_t sVar8;
  ulong uVar9;
  pointer pBVar10;
  long lVar11;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  ParamDict pd;
  bool local_cb5;
  int local_cb4;
  int local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  ulong local_ca0;
  Net *local_c98;
  vector<int,_std::allocator<int>_> *local_c90;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_c88;
  int local_c7c;
  Layer *local_c78;
  DataReader *local_c70;
  long *local_c68 [2];
  long local_c58 [2];
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c48;
  vector<int,_std::allocator<int>_> *local_c40;
  long *local_c38 [2];
  long local_c28 [30];
  char local_b38 [256];
  char local_a38 [264];
  ParamDict local_930;
  
  local_c7c = 0;
  local_c98 = this;
  iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar5 == 1) {
    if (local_c7c == 0x7685dd) {
      local_ca4 = 0;
      local_ca8 = 0;
      iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar5 == 1) {
        iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_ca8);
        pNVar4 = local_c98;
        if (iVar5 == 1) {
          if ((0 < (long)local_ca4) && (0 < local_ca8)) {
            local_c48 = &local_c98->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_c48,(long)local_ca4);
            local_c88 = &pNVar4->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(local_c88,(long)local_ca8);
            ParamDict::ParamDict(&local_930);
            local_cb4 = 0;
            local_cb5 = 0 < local_ca4;
            if (0 < local_ca4) {
              local_ca0 = 0;
              local_c70 = dr;
              do {
                local_cac = 0;
                local_cb0 = 0;
                iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_b38);
                if (iVar5 == 1) {
                  iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_a38);
                  if (iVar5 != 1) {
                    load_param();
                    goto LAB_0011f9bf;
                  }
                  iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_cac);
                  if (iVar5 != 1) {
                    load_param();
                    goto LAB_0011f9bf;
                  }
                  iVar5 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_cb0);
                  if (iVar5 != 1) {
                    load_param();
                    goto LAB_0011f9bf;
                  }
                  pLVar7 = create_layer(local_b38);
                  if (pLVar7 == (Layer *)0x0) {
                    pLVar7 = create_custom_layer(local_c98,local_b38);
                  }
                  if (pLVar7 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered\n",local_b38);
                    clear(local_c98);
                    uVar9 = 1;
                  }
                  else {
                    local_c38[0] = local_c28;
                    sVar8 = strlen(local_b38);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c38,local_b38,local_b38 + sVar8);
                    std::__cxx11::string::operator=((string *)&pLVar7->type,(string *)local_c38);
                    if (local_c38[0] != local_c28) {
                      operator_delete(local_c38[0],local_c28[0] + 1);
                    }
                    local_c38[0] = local_c28;
                    sVar8 = strlen(local_a38);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c38,local_a38,local_a38 + sVar8);
                    std::__cxx11::string::operator=((string *)&pLVar7->name,(string *)local_c38);
                    if (local_c38[0] != local_c28) {
                      operator_delete(local_c38[0],local_c28[0] + 1);
                    }
                    local_c90 = &pLVar7->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_c90,(long)local_cac);
                    bVar3 = 0 < local_cac;
                    uVar9 = 5;
                    local_c78 = pLVar7;
                    if (0 < local_cac) {
                      lVar11 = 0;
                      do {
                        iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                        if (iVar5 == 1) {
                          iVar6 = find_blob_index_by_name(local_c98,(char *)local_c38);
                          if (iVar6 == -1) {
                            pBVar10 = (local_c88->
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                      _M_impl.super__Vector_impl_data._M_start;
                            local_c68[0] = local_c58;
                            sVar8 = strlen((char *)local_c38);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_c68,local_c38,(long)local_c38 + sVar8);
                            std::__cxx11::string::operator=
                                      ((string *)(pBVar10 + (int)local_ca0),(string *)local_c68);
                            if (local_c68[0] != local_c58) {
                              operator_delete(local_c68[0],local_c58[0] + 1);
                            }
                            iVar6 = (int)local_ca0;
                            local_ca0 = (ulong)(iVar6 + 1);
                            dr = local_c70;
                          }
                          pBVar10 = (local_c88->
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                    _M_impl.super__Vector_impl_data._M_start;
                          __position._M_current =
                               pBVar10[iVar6].consumers.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              pBVar10[iVar6].consumers.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&pBVar10[iVar6].consumers,
                                       __position,&local_cb4);
                          }
                          else {
                            *__position._M_current = local_cb4;
                            pBVar10[iVar6].consumers.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                          (local_c90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar11] = iVar6;
                        }
                        else {
                          load_param();
                        }
                        if (iVar5 != 1) {
                          uVar9 = 1;
                          goto LAB_0011f813;
                        }
                        lVar11 = lVar11 + 1;
                        bVar3 = lVar11 < local_cac;
                      } while (lVar11 < local_cac);
                      uVar9 = 5;
                    }
LAB_0011f813:
                    pLVar7 = local_c78;
                    if (!bVar3) {
                      local_c40 = &local_c78->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_c40,(long)local_cb0);
                      local_c90 = (vector<int,_std::allocator<int>_> *)
                                  CONCAT71(local_c90._1_7_,0 < local_cb0);
                      uVar9 = 8;
                      if (0 < local_cb0) {
                        lVar11 = 0;
                        do {
                          pBVar10 = (local_c88->
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                    _M_impl.super__Vector_impl_data._M_start + (int)local_ca0;
                          iVar5 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                          if (iVar5 == 1) {
                            local_c68[0] = local_c58;
                            sVar8 = strlen((char *)local_c38);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_c68,local_c38,(long)local_c38 + sVar8);
                            std::__cxx11::string::operator=((string *)pBVar10,(string *)local_c68);
                            if (local_c68[0] != local_c58) {
                              operator_delete(local_c68[0],local_c58[0] + 1);
                            }
                            pBVar10->producer = local_cb4;
                            (local_c40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar11] = (int)local_ca0;
                            local_ca0 = (ulong)((int)local_ca0 + 1);
                            dr = local_c70;
                            pLVar7 = local_c78;
                          }
                          else {
                            load_param();
                          }
                          if (iVar5 != 1) {
                            uVar9 = 1;
                            goto LAB_0011f946;
                          }
                          lVar11 = lVar11 + 1;
                          local_c90 = (vector<int,_std::allocator<int>_> *)
                                      CONCAT71(local_c90._1_7_,lVar11 < local_cb0);
                        } while (lVar11 < local_cb0);
                        uVar9 = 8;
                      }
LAB_0011f946:
                      if (((ulong)local_c90 & 1) == 0) {
                        iVar5 = ParamDict::load_param(&local_930,dr);
                        if (iVar5 == 0) {
                          iVar5 = (*pLVar7->_vptr_Layer[2])(pLVar7,&local_930);
                          if (iVar5 == 0) {
                            (local_c48->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[local_cb4] = pLVar7;
                            uVar9 = 0;
                            goto LAB_0011f9c4;
                          }
                          load_param();
                        }
                        else {
                          load_param();
                        }
                        uVar9 = 0;
                      }
                    }
                  }
                }
                else {
                  load_param();
LAB_0011f9bf:
                  uVar9 = 1;
                }
LAB_0011f9c4:
                if ((uVar9 & 0xb) != 0) break;
                local_cb4 = local_cb4 + 1;
                local_cb5 = local_cb4 < local_ca4;
              } while (local_cb4 < local_ca4);
            }
            lVar11 = 0x8c0;
            do {
              piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar11);
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  __ptr = *(void **)((long)&local_930.params[0].type + lVar11);
                  plVar2 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
                  if (plVar2 == (long *)0x0) {
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                  }
                  else {
                    (**(code **)(*plVar2 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
              lVar11 = lVar11 + -0x48;
            } while (lVar11 != -0x40);
            return -(uint)local_cb5;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        fprintf(stderr, "parse " #v " failed\n"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %s not exists or registered\n", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d %s\n", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 fprintf(stderr, "new blob %s\n", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}